

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O3

void __thiscall LargeGapGrayCode::printStatisticsHeader(LargeGapGrayCode *this)

{
  *(undefined8 *)(std::__cxx11::string::_M_create + *(long *)(std::cout + -0x18)) = 5;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"n",1);
  *(undefined8 *)(std::__cxx11::string::_M_create + *(long *)(std::cout + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Method",6);
  *(undefined8 *)(std::__cxx11::string::_M_create + *(long *)(std::cout + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MinGap",6);
  *(undefined8 *)(std::__cxx11::string::_M_create + *(long *)(std::cout + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MaxGap",6);
  *(undefined8 *)(std::__cxx11::string::_M_create + *(long *)(std::cout + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MinCount",8);
  *(undefined8 *)(std::__cxx11::string::_M_create + *(long *)(std::cout + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MaxCount",8);
  *(undefined8 *)(std::__cxx11::string::_M_create + *(long *)(std::cout + -0x18)) = 0xe;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"GapVariance",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "------------------------------------------------------------------------------------",
             0x54);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  return;
}

Assistant:

void LargeGapGrayCode::printStatisticsHeader()
{
	std::cout 	<< std::setw(5) << "n"
			<< std::setw(12) << "Method"
			<< std::setw(12) << "MinGap"
			<< std::setw(12) << "MaxGap"
			<< std::setw(12) << "MinCount"
			<< std::setw(12) << "MaxCount"
			<< std::setw(14) << "GapVariance" << std::endl;
	std::cout << "------------------------------------------------------------------------------------" << std::endl;
}